

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLCommonTest_sizeInBytesReferenceTest_Test::TestBody
          (OpenDDLCommonTest_sizeInBytesReferenceTest_Test *this)

{
  bool bVar1;
  Text *this_00;
  Name *this_01;
  Reference *pRVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  size_t size;
  Name *name;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  size_t local_28;
  Name *local_20;
  
  this_00 = (Text *)operator_new(0x18);
  Text::Text(this_00,"test",4);
  this_01 = (Name *)operator_new(0x10);
  Name::Name(this_01,GlobalName,this_00);
  local_20 = this_01;
  pRVar2 = (Reference *)operator_new(0x10);
  Reference::Reference(pRVar2,1,&local_20);
  local_28 = Reference::sizeInBytes(pRVar2);
  local_48.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_38,"4U","size",(uint *)&local_48,&local_28);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Reference::~Reference(pRVar2);
  operator_delete(pRVar2,0x10);
  pRVar2 = (Reference *)operator_new(0x10);
  Reference::Reference(pRVar2,0,(Name **)0x0);
  local_28 = Reference::sizeInBytes(pRVar2);
  local_48.ptr_ = local_48.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_38,"0U","size",(uint *)&local_48,&local_28);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Reference::~Reference(pRVar2);
  operator_delete(pRVar2,0x10);
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, sizeInBytesReferenceTest) {
    Text *id = new Text("test", 4);
    Name *name = new Name(GlobalName, id);
    Reference *ref1(new Reference(1, &name));
    size_t size(ref1->sizeInBytes());
    EXPECT_EQ(4U, size);
    delete ref1;

    Reference *ref2(new Reference(0, nullptr));
    size = ref2->sizeInBytes();
    EXPECT_EQ(0U, size);
    delete ref2;
}